

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

void disas_simd_scalar_three_reg_same_fp16(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  uint32_t reg;
  uint32_t reg_00;
  uint32_t uVar2;
  uint32_t reg_01;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  TCGv_ptr arg3;
  TCGv_i32 arg1;
  TCGv_i32 arg2;
  TCGv_i32 retval;
  TCGv_i32 tcg_res;
  TCGv_i32 tcg_op2;
  TCGv_i32 tcg_op1;
  TCGv_ptr fpst;
  int fpopcode;
  _Bool a;
  _Bool u;
  int rm;
  int opcode;
  int rn;
  int rd;
  TCGContext_conflict1 *tcg_ctx;
  uint32_t insn_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  reg = extract32(insn,0,5);
  reg_00 = extract32(insn,5,5);
  uVar2 = extract32(insn,0xb,3);
  reg_01 = extract32(insn,0x10,5);
  uVar3 = extract32(insn,0x1d,1);
  uVar4 = extract32(insn,0x17,1);
  uVar5 = uVar2 | (uint)(uVar4 != 0) << 3 | (uint)(uVar3 != 0) << 4;
  if ((((uVar5 - 3 < 2) || (uVar5 == 7)) || (uVar5 == 0xf)) ||
     (((uVar5 - 0x14 < 2 || (uVar5 == 0x1a)) || (uVar5 == 0x1c || uVar5 == 0x1d)))) {
    _Var1 = isar_feature_aa64_fp16(s->isar);
    if (!_Var1) {
      unallocated_encoding_aarch64(s);
    }
    _Var1 = fp_access_check(s);
    if (_Var1) {
      arg3 = get_fpstatus_ptr_aarch64(tcg_ctx_00,true);
      arg1 = read_fp_hreg(s,reg_00);
      arg2 = read_fp_hreg(s,reg_01);
      retval = tcg_temp_new_i32(tcg_ctx_00);
      if (0x19 < uVar5 - 3 && uVar5 != 0x1d) {
LAB_008385c7:
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                   ,0x256c,(char *)0x0);
      }
      switch((long)&switchD_008384ab::switchdataD_0137c700 +
             (long)(int)(&switchD_008384ab::switchdataD_0137c700)[uVar5 - 3]) {
      case 0x8384ad:
        gen_helper_advsimd_mulxh(tcg_ctx_00,retval,arg1,arg2,arg3);
        break;
      case 0x8384cb:
        gen_helper_advsimd_ceq_f16(tcg_ctx_00,retval,arg1,arg2,arg3);
        break;
      case 0x8384e9:
        gen_helper_recpsf_f16(tcg_ctx_00,retval,arg1,arg2,arg3);
        break;
      case 0x838507:
        gen_helper_rsqrtsf_f16(tcg_ctx_00,retval,arg1,arg2,arg3);
        break;
      case 0x838525:
        gen_helper_advsimd_cge_f16(tcg_ctx_00,retval,arg1,arg2,arg3);
        break;
      case 0x838543:
        gen_helper_advsimd_acge_f16(tcg_ctx_00,retval,arg1,arg2,arg3);
        break;
      case 0x83855e:
        gen_helper_advsimd_subh(tcg_ctx_00,retval,arg1,arg2,arg3);
        tcg_gen_andi_i32_aarch64(tcg_ctx_00,retval,retval,0x7fff);
        break;
      case 0x83858f:
        gen_helper_advsimd_cgt_f16(tcg_ctx_00,retval,arg1,arg2,arg3);
        break;
      case 0x8385aa:
        gen_helper_advsimd_acgt_f16(tcg_ctx_00,retval,arg1,arg2,arg3);
        break;
      case 0x8385c5:
        goto LAB_008385c7;
      }
      write_fp_sreg(s,reg,retval);
      tcg_temp_free_i32(tcg_ctx_00,retval);
      tcg_temp_free_i32(tcg_ctx_00,arg1);
      tcg_temp_free_i32(tcg_ctx_00,arg2);
      tcg_temp_free_ptr(tcg_ctx_00,arg3);
    }
  }
  else {
    unallocated_encoding_aarch64(s);
  }
  return;
}

Assistant:

static void disas_simd_scalar_three_reg_same_fp16(DisasContext *s,
                                                  uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int rd = extract32(insn, 0, 5);
    int rn = extract32(insn, 5, 5);
    int opcode = extract32(insn, 11, 3);
    int rm = extract32(insn, 16, 5);
    bool u = extract32(insn, 29, 1);
    bool a = extract32(insn, 23, 1);
    int fpopcode = opcode | (a << 3) |  (u << 4);
    TCGv_ptr fpst;
    TCGv_i32 tcg_op1;
    TCGv_i32 tcg_op2;
    TCGv_i32 tcg_res;

    switch (fpopcode) {
    case 0x03: /* FMULX */
    case 0x04: /* FCMEQ (reg) */
    case 0x07: /* FRECPS */
    case 0x0f: /* FRSQRTS */
    case 0x14: /* FCMGE (reg) */
    case 0x15: /* FACGE */
    case 0x1a: /* FABD */
    case 0x1c: /* FCMGT (reg) */
    case 0x1d: /* FACGT */
        break;
    default:
        unallocated_encoding(s);
        return;
    }

    if (!dc_isar_feature(aa64_fp16, s)) {
        unallocated_encoding(s);
    }

    if (!fp_access_check(s)) {
        return;
    }

    fpst = get_fpstatus_ptr(tcg_ctx, true);

    tcg_op1 = read_fp_hreg(s, rn);
    tcg_op2 = read_fp_hreg(s, rm);
    tcg_res = tcg_temp_new_i32(tcg_ctx);

    switch (fpopcode) {
    case 0x03: /* FMULX */
        gen_helper_advsimd_mulxh(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
        break;
    case 0x04: /* FCMEQ (reg) */
        gen_helper_advsimd_ceq_f16(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
        break;
    case 0x07: /* FRECPS */
        gen_helper_recpsf_f16(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
        break;
    case 0x0f: /* FRSQRTS */
        gen_helper_rsqrtsf_f16(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
        break;
    case 0x14: /* FCMGE (reg) */
        gen_helper_advsimd_cge_f16(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
        break;
    case 0x15: /* FACGE */
        gen_helper_advsimd_acge_f16(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
        break;
    case 0x1a: /* FABD */
        gen_helper_advsimd_subh(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
        tcg_gen_andi_i32(tcg_ctx, tcg_res, tcg_res, 0x7fff);
        break;
    case 0x1c: /* FCMGT (reg) */
        gen_helper_advsimd_cgt_f16(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
        break;
    case 0x1d: /* FACGT */
        gen_helper_advsimd_acgt_f16(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
        break;
    default:
        g_assert_not_reached();
    }

    write_fp_sreg(s, rd, tcg_res);


    tcg_temp_free_i32(tcg_ctx, tcg_res);
    tcg_temp_free_i32(tcg_ctx, tcg_op1);
    tcg_temp_free_i32(tcg_ctx, tcg_op2);
    tcg_temp_free_ptr(tcg_ctx, fpst);
}